

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

StringView __thiscall Corrade::Containers::String::findOr(String *this,char character,char *fail)

{
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_40;
  char *local_30;
  char *fail_local;
  String *pSStack_20;
  char character_local;
  String *this_local;
  
  local_30 = fail;
  fail_local._7_1_ = character;
  pSStack_20 = this;
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_40,this);
  BVar1 = BasicStringView<const_char>::findOr(&local_40,fail_local._7_1_,local_30);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const char character, const char* const fail) const {
    return StringView{*this}.findOr(character, fail);
}